

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::ShaderBuiltinConstantCase::~ShaderBuiltinConstantCase
          (ShaderBuiltinConstantCase *this)

{
  ~ShaderBuiltinConstantCase(this);
  operator_delete(this,0xa8);
  return;
}

Assistant:

ShaderBuiltinConstantCase::~ShaderBuiltinConstantCase (void)
{
}